

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderStairs<ImPlot::GetterXsYs<float>,ImPlot::TransformerLinLog>
               (GetterXsYs<float> *getter,TransformerLinLog *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  ImVec2 IVar3;
  ImPlotPlot *pIVar4;
  double dVar5;
  float fVar6;
  ImPlotContext *pIVar7;
  ImPlotContext *pIVar8;
  ImDrawList *this;
  long lVar9;
  int iVar10;
  int iVar11;
  ImPlotContext *gp;
  float fVar12;
  float fVar13;
  ImVec2 p12;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_80;
  double local_78;
  undefined8 uStack_70;
  ImDrawList *local_68;
  ImVec2 local_60;
  undefined1 local_58 [8];
  TransformerLinLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar7 = GImPlot;
  pIVar4 = GImPlot->CurrentPlot;
  local_68 = DrawList;
  if (((pIVar4->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar10 = getter->Count;
    local_48 = iVar10 + -1;
    local_40 = line_weight * 0.5;
    lVar9 = (long)((getter->Offset % iVar10 + iVar10) % iVar10) * (long)getter->Stride;
    local_78 = (double)*(float *)((long)getter->Xs + lVar9);
    uStack_70 = 0;
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    dVar5 = log10((double)*(float *)((long)getter->Ys + lVar9) /
                  pIVar4->YAxis[transformer->YAxis].Range.Min);
    iVar10 = transformer->YAxis;
    pIVar4 = pIVar7->CurrentPlot;
    dVar2 = pIVar4->YAxis[iVar10].Range.Min;
    IVar3 = pIVar7->PixelRange[iVar10].Min;
    local_3c.y = (float)(pIVar7->My[iVar10] *
                         (((double)(float)(dVar5 / pIVar7->LogDenY[iVar10]) *
                           (pIVar4->YAxis[iVar10].Range.Max - dVar2) + dVar2) - dVar2) +
                        (double)IVar3.y);
    local_3c.x = (float)(pIVar7->Mx * (local_78 - (pIVar4->XAxis).Range.Min) + (double)IVar3.x);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterXsYs<float>,ImPlot::TransformerLinLog>>
              ((StairsRenderer<ImPlot::GetterXsYs<float>,_ImPlot::TransformerLinLog> *)local_58,
               local_68,&pIVar4->PlotRect);
  }
  else {
    iVar10 = getter->Count;
    lVar9 = (long)((getter->Offset % iVar10 + iVar10) % iVar10) * (long)getter->Stride;
    local_78 = (double)*(float *)((long)getter->Xs + lVar9);
    uStack_70 = 0;
    dVar5 = log10((double)*(float *)((long)getter->Ys + lVar9) /
                  pIVar4->YAxis[transformer->YAxis].Range.Min);
    iVar10 = transformer->YAxis;
    pIVar4 = pIVar7->CurrentPlot;
    dVar2 = pIVar4->YAxis[iVar10].Range.Min;
    IVar3 = pIVar7->PixelRange[iVar10].Min;
    local_58._4_4_ =
         (float)(pIVar7->My[iVar10] *
                 (((double)(float)(dVar5 / pIVar7->LogDenY[iVar10]) *
                   (pIVar4->YAxis[iVar10].Range.Max - dVar2) + dVar2) - dVar2) + (double)IVar3.y);
    local_58._0_4_ = (float)(pIVar7->Mx * (local_78 - (pIVar4->XAxis).Range.Min) + (double)IVar3.x);
    iVar10 = getter->Count;
    if (1 < iVar10) {
      iVar11 = 1;
      do {
        pIVar8 = GImPlot;
        lVar9 = (long)(((getter->Offset + iVar11) % iVar10 + iVar10) % iVar10) *
                (long)getter->Stride;
        local_78 = (double)*(float *)((long)getter->Xs + lVar9);
        uStack_70 = 0;
        dVar5 = log10((double)*(float *)((long)getter->Ys + lVar9) /
                      GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        this = local_68;
        iVar10 = transformer->YAxis;
        pIVar4 = pIVar8->CurrentPlot;
        dVar2 = pIVar4->YAxis[iVar10].Range.Min;
        IVar3 = pIVar8->PixelRange[iVar10].Min;
        fVar12 = (float)(pIVar8->Mx * (local_78 - (pIVar4->XAxis).Range.Min) + (double)IVar3.x);
        fVar13 = (float)(pIVar8->My[iVar10] *
                         (((double)(float)(dVar5 / pIVar8->LogDenY[iVar10]) *
                           (pIVar4->YAxis[iVar10].Range.Max - dVar2) + dVar2) - dVar2) +
                        (double)IVar3.y);
        local_60.y = fVar13;
        local_60.x = fVar12;
        pIVar4 = pIVar7->CurrentPlot;
        fVar6 = (float)local_58._4_4_;
        if (fVar13 <= (float)local_58._4_4_) {
          fVar6 = fVar13;
        }
        if ((fVar6 < (pIVar4->PlotRect).Max.y) &&
           (fVar6 = (float)(~-(uint)(fVar13 <= (float)local_58._4_4_) & (uint)fVar13 |
                           -(uint)(fVar13 <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar6 && fVar6 != *pfVar1)) {
          fVar6 = (float)local_58._0_4_;
          if (fVar12 <= (float)local_58._0_4_) {
            fVar6 = fVar12;
          }
          if ((fVar6 < (pIVar4->PlotRect).Max.x) &&
             (fVar6 = (float)(-(uint)(fVar12 <= (float)local_58._0_4_) & local_58._0_4_ |
                             ~-(uint)(fVar12 <= (float)local_58._0_4_) & (uint)fVar12),
             (pIVar4->PlotRect).Min.x <= fVar6 && fVar6 != (pIVar4->PlotRect).Min.x)) {
            local_80.y = (float)local_58._4_4_;
            local_80.x = fVar12;
            ImDrawList::AddLine(local_68,(ImVec2 *)local_58,&local_80,col,line_weight);
            ImDrawList::AddLine(this,&local_80,&local_60,col,line_weight);
          }
        }
        iVar11 = iVar11 + 1;
        iVar10 = getter->Count;
        local_58 = (undefined1  [8])local_60;
      } while (iVar11 < iVar10);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}